

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O2

void squall::detail::push_aux<Foo>(HSQUIRRELVM vm,Foo *v)

{
  bool bVar1;
  KlassTable *this;
  HSQOBJECT obj;
  HSQOBJECT sqo;
  
  this = (KlassTable *)sq_getforeignptr(vm);
  bVar1 = KlassTable::find_klass_object<Foo>(this,&sqo);
  if (bVar1) {
    obj._4_4_ = 0;
    obj._type = sqo._type;
    obj._unVal.pTable = sqo._unVal.pTable;
    sq_pushobject(vm,obj);
    sq_createinstance(vm,-1);
    sq_setinstanceup(vm,-1,v);
    sq_remove(vm,-2);
  }
  else {
    sq_pushuserpointer(vm,v);
  }
  return;
}

Assistant:

inline
void push_aux(HSQUIRRELVM vm, T* v) {
    HSQOBJECT sqo;
    if (klass_table(vm).find_klass_object<T>(sqo)) {
        sq_pushobject(vm, sqo);
        sq_createinstance(vm, -1);
        sq_setinstanceup(vm, -1, v);
        sq_remove(vm, -2);
    } else {
        sq_pushuserpointer(vm, v);
    }
}